

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O2

int32_t __thiscall cppnet::BufferQueue::MoveReadPt(BufferQueue *this,int32_t len)

{
  shared_ptr<cppnet::BufferBlock> *this_00;
  element_type *peVar1;
  int iVar2;
  int iVar3;
  shared_ptr<cppnet::BufferBlock> buffer_read;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_60;
  element_type *local_50;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_48 = &(this->_buffer_list)._head.
              super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,local_48);
  if (len < 0) {
    iVar3 = (*((local_70._M_ptr)->super_InnerBuffer).super_Buffer._vptr_Buffer[6])
                      (local_70._M_ptr,(ulong)(uint)len);
  }
  else {
    this_00 = &this->_buffer_write;
    iVar3 = 0;
    while (local_70._M_ptr != (element_type *)0x0) {
      iVar2 = (*((local_70._M_ptr)->super_InnerBuffer).super_Buffer._vptr_Buffer[6])
                        (local_70._M_ptr,(ulong)(uint)(len - iVar3));
      iVar3 = iVar3 + iVar2;
      if (len <= iVar3) break;
      peVar1 = (this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      if (local_70._M_ptr == peVar1) {
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,
                   &(peVar1->super_ListSlot<cppnet::BufferBlock>)._next.
                    super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
        local_50 = local_60._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
        if (local_50 == (element_type *)0x0) {
          (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x12])(this);
          break;
        }
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,
                   &(((this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>)
                     ._M_ptr)->super_ListSlot<cppnet::BufferBlock>)._next.
                    super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>,
                   &local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      }
      List<cppnet::BufferBlock>::PopFront((List<cppnet::BufferBlock> *)&stack0xffffffffffffffc0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,local_48);
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_70,&local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    }
  }
  this->_can_read_length = this->_can_read_length - iVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  return iVar3;
}

Assistant:

int32_t BufferQueue::MoveReadPt(int32_t len) {
    int32_t total_read_len = 0;
    auto buffer_read = _buffer_list.GetHead();

    if (len >= 0) {
        while (buffer_read) {
            total_read_len += buffer_read->MoveReadPt(len - total_read_len);

            if (total_read_len >= len) {
                break;
            }

            if (buffer_read == _buffer_write) {
                if (_buffer_write->GetNext()) {
                    _buffer_write = _buffer_write->GetNext();

                } else {
                    Reset();
                    break;
                }
            }
            _buffer_list.PopFront();
            buffer_read = _buffer_list.GetHead();
        }

    } else {
        total_read_len += buffer_read->MoveReadPt(len);
    }

    _can_read_length -= total_read_len;
    return total_read_len;
}